

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O0

Color plot::operator*(float *lhs,Color *rhs)

{
  float fVar1;
  Color *rhs_local;
  float *lhs_local;
  
  fVar1 = *lhs;
  Color::Color((Color *)&lhs_local,fVar1 * rhs->r,fVar1 * rhs->g,fVar1 * rhs->b,fVar1 * rhs->a);
  return _lhs_local;
}

Assistant:

inline constexpr Color operator*(float const& lhs, Color const& rhs) {
    return {
        lhs*rhs.r,
        lhs*rhs.g,
        lhs*rhs.b,
        lhs*rhs.a
    };
}